

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::detail::ReferenceResolver::lookup_(ReferenceResolver *this,refdata *ra)

{
  NodeType_e NVar1;
  char *that;
  ulong sz;
  ulong uVar2;
  refdata *prVar3;
  Tree *this_00;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  csubstr *pcVar8;
  NodeData *pNVar9;
  char errmsg [1024];
  
  NVar1 = (ra->type).type;
  if ((NVar1 & (VALREF|KEYREF)) == NOTYPE) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar4 = (code *)swi(3);
      sVar7 = (*pcVar4)();
      return sVar7;
    }
    errmsg._24_16_ =
         (undefined1  [16])
         to_csubstr(
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   );
    errmsg[0] = '\0';
    errmsg[1] = '\0';
    errmsg[2] = '\0';
    errmsg[3] = '\0';
    errmsg[4] = '\0';
    errmsg[5] = '\0';
    errmsg[6] = '\0';
    errmsg[7] = '\0';
    errmsg[8] = -0x1e;
    errmsg[9] = 'f';
    errmsg[10] = '\0';
    errmsg[0xb] = '\0';
    errmsg[0xc] = '\0';
    errmsg[0xd] = '\0';
    errmsg[0xe] = '\0';
    errmsg[0xf] = '\0';
    errmsg[0x10] = '\0';
    errmsg[0x11] = '\0';
    errmsg[0x12] = '\0';
    errmsg[0x13] = '\0';
    errmsg[0x14] = '\0';
    errmsg[0x15] = '\0';
    errmsg[0x16] = '\0';
    errmsg[0x17] = '\0';
    (*(code *)PTR_error_impl_00234578)
              ("check failed: ra->type.is_key_ref() || ra->type.is_val_ref()",0x3c,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((char)NVar1 < '\0' == SUB41(((uint)NVar1 & 0x40) >> 6,0)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar4 = (code *)swi(3);
      sVar7 = (*pcVar4)();
      return sVar7;
    }
    errmsg._24_16_ =
         (undefined1  [16])
         to_csubstr(
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   );
    errmsg[0] = '\0';
    errmsg[1] = '\0';
    errmsg[2] = '\0';
    errmsg[3] = '\0';
    errmsg[4] = '\0';
    errmsg[5] = '\0';
    errmsg[6] = '\0';
    errmsg[7] = '\0';
    errmsg[8] = -0x1d;
    errmsg[9] = 'f';
    errmsg[10] = '\0';
    errmsg[0xb] = '\0';
    errmsg[0xc] = '\0';
    errmsg[0xd] = '\0';
    errmsg[0xe] = '\0';
    errmsg[0xf] = '\0';
    errmsg[0x10] = '\0';
    errmsg[0x11] = '\0';
    errmsg[0x12] = '\0';
    errmsg[0x13] = '\0';
    errmsg[0x14] = '\0';
    errmsg[0x15] = '\0';
    errmsg[0x16] = '\0';
    errmsg[0x17] = '\0';
    (*(code *)PTR_error_impl_00234578)
              ("check failed: ra->type.is_key_ref() != ra->type.is_val_ref()",0x3c,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((char)NVar1 < '\0') {
    pcVar8 = Tree::val_ref(this->t,ra->node);
  }
  else {
    if ((NVar1 & KEYREF) == NOTYPE) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar4 = (code *)swi(3);
        sVar7 = (*pcVar4)();
        return sVar7;
      }
      errmsg._24_16_ =
           (undefined1  [16])
           to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
      errmsg[0] = '\0';
      errmsg[1] = '\0';
      errmsg[2] = '\0';
      errmsg[3] = '\0';
      errmsg[4] = '\0';
      errmsg[5] = '\0';
      errmsg[6] = '\0';
      errmsg[7] = '\0';
      errmsg[8] = -0x15;
      errmsg[9] = 'f';
      errmsg[10] = '\0';
      errmsg[0xb] = '\0';
      errmsg[0xc] = '\0';
      errmsg[0xd] = '\0';
      errmsg[0xe] = '\0';
      errmsg[0xf] = '\0';
      errmsg[0x10] = '\0';
      errmsg[0x11] = '\0';
      errmsg[0x12] = '\0';
      errmsg[0x13] = '\0';
      errmsg[0x14] = '\0';
      errmsg[0x15] = '\0';
      errmsg[0x16] = '\0';
      errmsg[0x17] = '\0';
      (*(code *)PTR_error_impl_00234578)
                ("check failed: ra->type.is_key_ref()",0x23,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pcVar8 = Tree::key_ref(this->t,ra->node);
  }
  that = pcVar8->str;
  sz = pcVar8->len;
  do {
    uVar2 = ra->prev_anchor;
    if (uVar2 == 0xffffffffffffffff) {
      snprintf(errmsg,0x400,"anchor does not exist: \'%.*s\'",sz & 0xffffffff,that);
      error<1024ul>(&errmsg);
      return 0xffffffffffffffff;
    }
    if ((this->refs).m_size <= uVar2) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar4 = (code *)swi(3);
        sVar7 = (*pcVar4)();
        return sVar7;
      }
      errmsg._24_16_ =
           (undefined1  [16])
           to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
      errmsg[0] = '\0';
      errmsg[1] = '\0';
      errmsg[2] = '\0';
      errmsg[3] = '\0';
      errmsg[4] = '\0';
      errmsg[5] = '\0';
      errmsg[6] = '\0';
      errmsg[7] = '\0';
      errmsg[8] = 'h';
      errmsg[9] = '\\';
      errmsg[10] = '\0';
      errmsg[0xb] = '\0';
      errmsg[0xc] = '\0';
      errmsg[0xd] = '\0';
      errmsg[0xe] = '\0';
      errmsg[0xf] = '\0';
      errmsg[0x10] = '\0';
      errmsg[0x11] = '\0';
      errmsg[0x12] = '\0';
      errmsg[0x13] = '\0';
      errmsg[0x14] = '\0';
      errmsg[0x15] = '\0';
      errmsg[0x16] = '\0';
      errmsg[0x17] = '\0';
      (*(code *)PTR_error_impl_00234578)
                ("check failed: i < m_size",0x18,(anonymous_namespace)::s_default_callbacks);
    }
    prVar3 = (this->refs).m_stack;
    ra = prVar3 + uVar2;
    this_00 = this->t;
    sVar7 = prVar3[uVar2].node;
    pNVar9 = Tree::_p(this_00,sVar7);
    iVar6 = basic_substring<const_char>::compare(&(pNVar9->m_key).anchor,that,sz);
    if (iVar6 == 0) break;
    pNVar9 = Tree::_p(this_00,sVar7);
    iVar6 = basic_substring<const_char>::compare(&(pNVar9->m_val).anchor,that,sz);
  } while (iVar6 != 0);
  return ra->node;
}

Assistant:

size_t lookup_(refdata *C4_RESTRICT ra)
    {
        RYML_ASSERT(ra->type.is_key_ref() || ra->type.is_val_ref());
        RYML_ASSERT(ra->type.is_key_ref() != ra->type.is_val_ref());
        csubstr refname;
        if(ra->type.is_val_ref())
        {
            refname = t->val_ref(ra->node);
        }
        else
        {
            RYML_ASSERT(ra->type.is_key_ref());
            refname = t->key_ref(ra->node);
        }
        while(ra->prev_anchor != npos)
        {
            ra = &refs[ra->prev_anchor];
            if(t->has_anchor(ra->node, refname))
                return ra->node;
        }

        #ifndef RYML_ERRMSG_SIZE
          #define RYML_ERRMSG_SIZE 1024
        #endif

        char errmsg[RYML_ERRMSG_SIZE];
        snprintf(errmsg, RYML_ERRMSG_SIZE, "anchor does not exist: '%.*s'",
                 static_cast<int>(refname.size()), refname.data());
        c4::yml::error(errmsg);
        return NONE;
    }